

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::setRequireBrokerConnection
          (CommsInterface *this,bool requireBrokerConnection)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  CommsInterface *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  bVar2 = propertyLock(in_RDI);
  if (bVar2) {
    in_RDI->mRequireBrokerConnection = (bool)(bVar1 & 1);
    propertyUnLock((CommsInterface *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void CommsInterface::setRequireBrokerConnection(bool requireBrokerConnection)
{
    if (propertyLock()) {
        mRequireBrokerConnection = requireBrokerConnection;
        propertyUnLock();
    }
}